

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O3

int envy_bios_parse_inputdev(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  envy_bios_inputdev_entry *peVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  
  uVar2 = (bios->inputdev).offset;
  uVar8 = (ulong)uVar2;
  iVar12 = 0;
  if (uVar2 != 0) {
    bVar1 = (bios->dcb).version;
    if (bVar1 < 0x30) {
      (bios->inputdev).version = bVar1;
      (bios->inputdev).hlen = '\0';
      (bios->inputdev).entriesnum = '\b';
      (bios->inputdev).rlen = '\x01';
      uVar5 = 8;
      uVar10 = 0;
    }
    else {
      uVar5 = bios->length;
      if (uVar2 < uVar5) {
        (bios->inputdev).version = bios->data[uVar8];
        iVar12 = 0;
      }
      else {
        (bios->inputdev).version = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar8 = (ulong)(bios->inputdev).offset;
        uVar5 = bios->length;
        iVar12 = -0xe;
      }
      lVar6 = uVar8 + 1;
      if ((uint)lVar6 < uVar5) {
        (bios->inputdev).hlen = bios->data[lVar6];
        iVar11 = 0;
      }
      else {
        (bios->inputdev).hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar6);
        uVar8 = (ulong)(bios->inputdev).offset;
        uVar5 = bios->length;
        iVar11 = -0xe;
      }
      uVar10 = (uint)uVar8;
      lVar6 = uVar8 + 2;
      if ((uint)lVar6 < uVar5) {
        (bios->inputdev).entriesnum = bios->data[lVar6];
        iVar4 = 0;
      }
      else {
        (bios->inputdev).entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar6);
        uVar10 = (uint)(bios->inputdev).offset;
        uVar5 = bios->length;
        iVar4 = -0xe;
      }
      if ((uint)((ulong)uVar10 + 3) < uVar5) {
        (bios->inputdev).rlen = bios->data[(ulong)uVar10 + 3];
        iVar9 = 0;
      }
      else {
        (bios->inputdev).rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      if (((iVar11 != 0 || iVar12 != 0) || iVar4 != 0) || iVar9 != 0) {
        return -0xe;
      }
      uVar2 = (bios->inputdev).offset;
      uVar5 = (uint)(bios->inputdev).entriesnum * (uint)(bios->inputdev).rlen +
              (uint)(bios->inputdev).hlen;
      uVar10 = 4;
    }
    envy_bios_block(bios,(uint)uVar2,uVar5,"INPUTDEV",-1);
    uVar5 = (bios->inputdev).version - 0x20;
    if ((uVar5 < 0x21) && ((0x100010007U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
      bVar1 = (bios->inputdev).hlen;
      if (bVar1 < uVar10) {
        fprintf(_stderr,"INPUTDEV table header too short [%d < %d]\n",(ulong)bVar1,(ulong)uVar10);
      }
      else {
        bVar3 = (bios->inputdev).rlen;
        if (bVar3 != 0) {
          if (uVar10 < bVar1) {
            fprintf(_stderr,"INPUTDEV table header longer than expected [%d > %d]\n",(ulong)bVar1,
                    (ulong)uVar10);
            bVar3 = (bios->inputdev).rlen;
          }
          if (1 < bVar3) {
            envy_bios_parse_inputdev_cold_1();
          }
          bVar1 = (bios->inputdev).entriesnum;
          peVar7 = (envy_bios_inputdev_entry *)calloc((ulong)bVar1,4);
          (bios->inputdev).entries = peVar7;
          if (peVar7 != (envy_bios_inputdev_entry *)0x0) {
            if (bVar1 != 0) {
              uVar8 = 0;
              do {
                peVar7 = (bios->inputdev).entries;
                uVar5 = (uint)(bios->inputdev).rlen * (int)uVar8 +
                        (uint)(bios->inputdev).hlen + (uint)(bios->inputdev).offset;
                peVar7[uVar8].offset = (uint16_t)uVar5;
                uVar5 = uVar5 & 0xffff;
                if (bios->length <= uVar5) {
                  peVar7[uVar8].entry = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  return -0xe;
                }
                peVar7[uVar8].entry = bios->data[uVar5];
                uVar8 = uVar8 + 1;
              } while (uVar8 < (bios->inputdev).entriesnum);
            }
            (bios->inputdev).valid = '\x01';
            return 0;
          }
          return -0xc;
        }
        envy_bios_parse_inputdev_cold_2();
      }
    }
    else {
      envy_bios_parse_inputdev_cold_3();
    }
    iVar12 = -0x16;
  }
  return iVar12;
}

Assistant:

int envy_bios_parse_inputdev (struct envy_bios *bios) {
	struct envy_bios_inputdev *inputdev = &bios->inputdev;
	if (!inputdev->offset)
		return 0;
	int err = 0;
	int wanthlen = 4;
	int wantrlen = 1;
	if (bios->dcb.version >= 0x30) {
		err |= bios_u8(bios, inputdev->offset, &inputdev->version);
		err |= bios_u8(bios, inputdev->offset+1, &inputdev->hlen);
		err |= bios_u8(bios, inputdev->offset+2, &inputdev->entriesnum);
		err |= bios_u8(bios, inputdev->offset+3, &inputdev->rlen);
	} else {
		inputdev->version = bios->dcb.version;
		wanthlen = inputdev->hlen = 0;
		inputdev->entriesnum = 8;
		inputdev->rlen = 1;
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, inputdev->offset, inputdev->hlen + inputdev->rlen * inputdev->entriesnum, "INPUTDEV", -1);
	switch (inputdev->version) {
		case 0x20:
		case 0x21:
		case 0x22:
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown INPUTDEV table version %d.%d\n", inputdev->version >> 4, inputdev->version & 0xf);
			return -EINVAL;
	}
	if (inputdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("INPUTDEV table header too short [%d < %d]\n", inputdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (inputdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("INPUTDEV table record too short [%d < %d]\n", inputdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (inputdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("INPUTDEV table header longer than expected [%d > %d]\n", inputdev->hlen, wanthlen);
	}
	if (inputdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("INPUTDEV table record longer than expected [%d > %d]\n", inputdev->rlen, wantrlen);
	}
	inputdev->entries = calloc(inputdev->entriesnum, sizeof *inputdev->entries);
	if (!inputdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < inputdev->entriesnum; i++) {
		struct envy_bios_inputdev_entry *entry = &inputdev->entries[i];
		entry->offset = inputdev->offset + inputdev->hlen + inputdev->rlen * i;
		err |= bios_u8(bios, entry->offset, &entry->entry);
		if (err)
			return -EFAULT;
	}
	inputdev->valid = 1;
	return 0;
}